

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

I32 laszip_prepare_header_for_write(laszip_dll_struct *laszip_dll)

{
  uint local_1c;
  U32 i;
  laszip_dll_struct *laszip_dll_local;
  
  if (((laszip_dll->header).version_major == '\x01') && ((laszip_dll->header).version_minor < 5)) {
    if ((laszip_dll->header).point_data_format < 6) {
      if (3 < (laszip_dll->header).version_minor) {
        if ((ulong)(laszip_dll->header).number_of_point_records !=
            (laszip_dll->header).extended_number_of_point_records) {
          if ((laszip_dll->header).number_of_point_records != 0) {
            snprintf(laszip_dll->error,0x400,
                     "inconsistent number_of_point_records %lu and extended_number_of_point_records %llu"
                     ,(ulong)(laszip_dll->header).number_of_point_records,
                     (laszip_dll->header).extended_number_of_point_records);
            return 1;
          }
          if ((laszip_dll->header).extended_number_of_point_records < 0x100000000) {
            (laszip_dll->header).number_of_point_records =
                 (laszip_U32)(laszip_dll->header).extended_number_of_point_records;
          }
        }
        for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
          if ((ulong)(laszip_dll->header).number_of_points_by_return[local_1c] !=
              (laszip_dll->header).extended_number_of_points_by_return[local_1c]) {
            if ((laszip_dll->header).number_of_points_by_return[local_1c] != 0) {
              snprintf(laszip_dll->error,0x400,
                       "inconsistent number_of_points_by_return[%u] %lu and extended_number_of_points_by_return[%u] %llu"
                       ,(ulong)local_1c,
                       (ulong)(laszip_dll->header).number_of_points_by_return[local_1c],
                       (ulong)local_1c,
                       (laszip_dll->header).extended_number_of_points_by_return[local_1c]);
              return 1;
            }
            if ((laszip_dll->header).extended_number_of_points_by_return[local_1c] < 0x100000000) {
              (laszip_dll->header).number_of_points_by_return[local_1c] =
                   (laszip_U32)(laszip_dll->header).extended_number_of_points_by_return[local_1c];
            }
          }
        }
      }
    }
    else {
      (laszip_dll->header).number_of_point_records = 0;
      for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
        (laszip_dll->header).number_of_points_by_return[local_1c] = 0;
      }
    }
    laszip_dll_local._4_4_ = 0;
  }
  else {
    snprintf(laszip_dll->error,0x400,"unknown LAS version %d.%d",
             (ulong)(laszip_dll->header).version_major,(ulong)(laszip_dll->header).version_minor);
    laszip_dll_local._4_4_ = 1;
  }
  return laszip_dll_local._4_4_;
}

Assistant:

static I32
laszip_prepare_header_for_write(
    laszip_dll_struct*                 laszip_dll
)
{
  if ((laszip_dll->header.version_major != 1) || (laszip_dll->header.version_minor > 4))
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "unknown LAS version %d.%d", (I32)laszip_dll->header.version_major, (I32)laszip_dll->header.version_minor);
    return 1;
  }

  // check counters
  U32 i;

  if (laszip_dll->header.point_data_format > 5)
  {
    // legacy counters are zero for new point types

    laszip_dll->header.number_of_point_records = 0;
    for (i = 0; i < 5; i++)
    {
      laszip_dll->header.number_of_points_by_return[i] = 0;
    }
  }
  else if (laszip_dll->header.version_minor > 3)
  {
    // legacy counters must be zero or consistent for old point types

    if (laszip_dll->header.number_of_point_records != laszip_dll->header.extended_number_of_point_records)
    {
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wformat"
#endif
      if (laszip_dll->header.number_of_point_records != 0)
      {
        snprintf(laszip_dll->error, sizeof(laszip_dll->error), "inconsistent number_of_point_records %lu and extended_number_of_point_records %llu", laszip_dll->header.number_of_point_records, laszip_dll->header.extended_number_of_point_records);
        return 1;
      }     
      else if (laszip_dll->header.extended_number_of_point_records <= U32_MAX)
      {
        laszip_dll->header.number_of_point_records = (U32)laszip_dll->header.extended_number_of_point_records;
      }
    }
    for (i = 0; i < 5; i++)
    {
      if (laszip_dll->header.number_of_points_by_return[i] != laszip_dll->header.extended_number_of_points_by_return[i])
      {
        if (laszip_dll->header.number_of_points_by_return[i] != 0)
        {
          snprintf(laszip_dll->error, sizeof(laszip_dll->error), "inconsistent number_of_points_by_return[%u] %lu and extended_number_of_points_by_return[%u] %llu", i, laszip_dll->header.number_of_points_by_return[i], i, laszip_dll->header.extended_number_of_points_by_return[i]);
          return 1;
        }   
        else if (laszip_dll->header.extended_number_of_points_by_return[i] <= U32_MAX)
        {
          laszip_dll->header.number_of_points_by_return[i] = (U32)laszip_dll->header.extended_number_of_points_by_return[i];
        }
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
      }
    }
  }

  return 0;
}